

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

bool __thiscall tinyusdz::primvar::PrimVar::is_valid(PrimVar *this)

{
  uint32_t uVar1;
  bool bVar2;
  
  if ((this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar1 = tinyusdz::value::TimeSamples::type_id(&this->_ts);
    if (uVar1 == 0) {
      bVar2 = false;
    }
    else {
      uVar1 = tinyusdz::value::TimeSamples::type_id(&this->_ts);
      bVar2 = uVar1 != 1;
    }
    return bVar2;
  }
  bVar2 = has_value(this);
  return bVar2;
}

Assistant:

bool is_valid() const {
    if (has_timesamples()) {
      if ((_ts.type_id() == value::TypeId::TYPE_ID_INVALID) || (_ts.type_id() == value::TypeId::TYPE_ID_NULL)) {
        return false;
      }

      // TODO: Check if the type of timesamples is the same with the type of 'default' value
      return true;
    }

    // TODO: Make blocked valid?

    return has_value();
  }